

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlParserInputBufferPtrWrap(xmlParserInputBufferPtr buffer)

{
  PyObject *ret;
  xmlParserInputBufferPtr buffer_local;
  
  if (buffer == (xmlParserInputBufferPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    buffer_local = (xmlParserInputBufferPtr)&_Py_NoneStruct;
  }
  else {
    buffer_local = (xmlParserInputBufferPtr)PyCapsule_New(buffer,"xmlParserInputBufferPtr",0);
  }
  return (PyObject *)buffer_local;
}

Assistant:

PyObject *
libxml_xmlParserInputBufferPtrWrap(xmlParserInputBufferPtr buffer)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlParserInputBufferPtrWrap: buffer = %p\n", buffer);
#endif
    if (buffer == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) buffer,
                                     (char *) "xmlParserInputBufferPtr", NULL);
    return (ret);
}